

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

int __thiscall tcu::CaseTreeNode::findChildNdx(CaseTreeNode *this,string *name)

{
  __type_conflict _Var1;
  size_type sVar2;
  const_reference ppCVar3;
  string *__lhs;
  int local_24;
  int ndx;
  string *name_local;
  CaseTreeNode *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::size
                      (&this->m_children);
    if ((int)sVar2 <= local_24) {
      return -1;
    }
    ppCVar3 = std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::operator[]
                        (&this->m_children,(long)local_24);
    __lhs = getName_abi_cxx11_(*ppCVar3);
    _Var1 = std::operator==(__lhs,name);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int CaseTreeNode::findChildNdx (const std::string& name) const
{
	for (int ndx = 0; ndx < (int)m_children.size(); ++ndx)
	{
		if (m_children[ndx]->getName() == name)
			return ndx;
	}
	return NOT_FOUND;
}